

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_reset_matchState
                 (ZSTD_matchState_t *ms,ZSTD_cwksp *ws,ZSTD_compressionParameters *cParams,
                 ZSTD_compResetPolicy_e crp,ZSTD_indexResetPolicy_e forceResetIndex,
                 ZSTD_resetTarget_e forWho)

{
  uint uVar1;
  int iVar2;
  U32 *pUVar3;
  uint *puVar4;
  ZSTD_match_t *pZVar5;
  ZSTD_optimal_t *pZVar6;
  long local_70;
  uint local_68;
  uint local_64;
  long local_60;
  size_t h3Size;
  U32 hashLog3;
  size_t hSize;
  size_t chainSize;
  ZSTD_resetTarget_e forWho_local;
  ZSTD_indexResetPolicy_e forceResetIndex_local;
  ZSTD_compResetPolicy_e crp_local;
  ZSTD_compressionParameters *cParams_local;
  ZSTD_cwksp *ws_local;
  ZSTD_matchState_t *ms_local;
  
  if (cParams->strategy == ZSTD_fast) {
    local_60 = 0;
  }
  else {
    local_60 = 1L << ((byte)cParams->chainLog & 0x3f);
  }
  uVar1 = cParams->hashLog;
  if ((forWho == ZSTD_resetTarget_CCtx) && (cParams->minMatch == 3)) {
    if (cParams->windowLog < 0x12) {
      local_64 = cParams->windowLog;
    }
    else {
      local_64 = 0x11;
    }
    local_68 = local_64;
  }
  else {
    local_68 = 0;
  }
  if (local_68 == 0) {
    local_70 = 0;
  }
  else {
    local_70 = 1L << ((byte)local_68 & 0x3f);
  }
  if (forceResetIndex == ZSTDirp_reset) {
    ZSTD_window_init(&ms->window);
    ZSTD_cwksp_mark_tables_dirty(ws);
  }
  ms->hashLog3 = local_68;
  ZSTD_invalidateMatchState(ms);
  iVar2 = ZSTD_cwksp_reserve_failed(ws);
  if (iVar2 != 0) {
    __assert_fail("!ZSTD_cwksp_reserve_failed(ws)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2f8b,
                  "size_t ZSTD_reset_matchState(ZSTD_matchState_t *, ZSTD_cwksp *, const ZSTD_compressionParameters *, const ZSTD_compResetPolicy_e, const ZSTD_indexResetPolicy_e, const ZSTD_resetTarget_e)"
                 );
  }
  ZSTD_cwksp_clear_tables(ws);
  pUVar3 = (U32 *)ZSTD_cwksp_reserve_table(ws,(1L << ((byte)uVar1 & 0x3f)) << 2);
  ms->hashTable = pUVar3;
  pUVar3 = (U32 *)ZSTD_cwksp_reserve_table(ws,local_60 << 2);
  ms->chainTable = pUVar3;
  pUVar3 = (U32 *)ZSTD_cwksp_reserve_table(ws,local_70 << 2);
  ms->hashTable3 = pUVar3;
  iVar2 = ZSTD_cwksp_reserve_failed(ws);
  if (iVar2 == 0) {
    if (crp != ZSTDcrp_leaveDirty) {
      ZSTD_cwksp_clean_tables(ws);
    }
    if ((forWho == ZSTD_resetTarget_CCtx) && (6 < (int)cParams->strategy)) {
      puVar4 = (uint *)ZSTD_cwksp_reserve_aligned(ws,0x400);
      (ms->opt).litFreq = puVar4;
      puVar4 = (uint *)ZSTD_cwksp_reserve_aligned(ws,0x90);
      (ms->opt).litLengthFreq = puVar4;
      puVar4 = (uint *)ZSTD_cwksp_reserve_aligned(ws,0xd4);
      (ms->opt).matchLengthFreq = puVar4;
      puVar4 = (uint *)ZSTD_cwksp_reserve_aligned(ws,0x80);
      (ms->opt).offCodeFreq = puVar4;
      pZVar5 = (ZSTD_match_t *)ZSTD_cwksp_reserve_aligned(ws,0x8008);
      (ms->opt).matchTable = pZVar5;
      pZVar6 = (ZSTD_optimal_t *)ZSTD_cwksp_reserve_aligned(ws,0x1c01c);
      (ms->opt).priceTable = pZVar6;
    }
    uVar1 = cParams->chainLog;
    (ms->cParams).windowLog = cParams->windowLog;
    (ms->cParams).chainLog = uVar1;
    uVar1 = cParams->searchLog;
    (ms->cParams).hashLog = cParams->hashLog;
    (ms->cParams).searchLog = uVar1;
    uVar1 = cParams->targetLength;
    (ms->cParams).minMatch = cParams->minMatch;
    (ms->cParams).targetLength = uVar1;
    (ms->cParams).strategy = cParams->strategy;
    iVar2 = ZSTD_cwksp_reserve_failed(ws);
    if (iVar2 == 0) {
      ms_local = (ZSTD_matchState_t *)0x0;
    }
    else {
      ms_local = (ZSTD_matchState_t *)0xffffffffffffffc0;
    }
  }
  else {
    ms_local = (ZSTD_matchState_t *)0xffffffffffffffc0;
  }
  return (size_t)ms_local;
}

Assistant:

static size_t
ZSTD_reset_matchState(ZSTD_matchState_t* ms,
                      ZSTD_cwksp* ws,
                const ZSTD_compressionParameters* cParams,
                const ZSTD_compResetPolicy_e crp,
                const ZSTD_indexResetPolicy_e forceResetIndex,
                const ZSTD_resetTarget_e forWho)
{
    size_t const chainSize = (cParams->strategy == ZSTD_fast) ? 0 : ((size_t)1 << cParams->chainLog);
    size_t const hSize = ((size_t)1) << cParams->hashLog;
    U32    const hashLog3 = ((forWho == ZSTD_resetTarget_CCtx) && cParams->minMatch==3) ? MIN(ZSTD_HASHLOG3_MAX, cParams->windowLog) : 0;
    size_t const h3Size = hashLog3 ? ((size_t)1) << hashLog3 : 0;

    DEBUGLOG(4, "reset indices : %u", forceResetIndex == ZSTDirp_reset);
    if (forceResetIndex == ZSTDirp_reset) {
        ZSTD_window_init(&ms->window);
        ZSTD_cwksp_mark_tables_dirty(ws);
    }

    ms->hashLog3 = hashLog3;

    ZSTD_invalidateMatchState(ms);

    assert(!ZSTD_cwksp_reserve_failed(ws)); /* check that allocation hasn't already failed */

    ZSTD_cwksp_clear_tables(ws);

    DEBUGLOG(5, "reserving table space");
    /* table Space */
    ms->hashTable = (U32*)ZSTD_cwksp_reserve_table(ws, hSize * sizeof(U32));
    ms->chainTable = (U32*)ZSTD_cwksp_reserve_table(ws, chainSize * sizeof(U32));
    ms->hashTable3 = (U32*)ZSTD_cwksp_reserve_table(ws, h3Size * sizeof(U32));
    RETURN_ERROR_IF(ZSTD_cwksp_reserve_failed(ws), memory_allocation,
                    "failed a workspace allocation in ZSTD_reset_matchState");

    DEBUGLOG(4, "reset table : %u", crp!=ZSTDcrp_leaveDirty);
    if (crp!=ZSTDcrp_leaveDirty) {
        /* reset tables only */
        ZSTD_cwksp_clean_tables(ws);
    }

    /* opt parser space */
    if ((forWho == ZSTD_resetTarget_CCtx) && (cParams->strategy >= ZSTD_btopt)) {
        DEBUGLOG(4, "reserving optimal parser space");
        ms->opt.litFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (1<<Litbits) * sizeof(unsigned));
        ms->opt.litLengthFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxLL+1) * sizeof(unsigned));
        ms->opt.matchLengthFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxML+1) * sizeof(unsigned));
        ms->opt.offCodeFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxOff+1) * sizeof(unsigned));
        ms->opt.matchTable = (ZSTD_match_t*)ZSTD_cwksp_reserve_aligned(ws, (ZSTD_OPT_NUM+1) * sizeof(ZSTD_match_t));
        ms->opt.priceTable = (ZSTD_optimal_t*)ZSTD_cwksp_reserve_aligned(ws, (ZSTD_OPT_NUM+1) * sizeof(ZSTD_optimal_t));
    }

    ms->cParams = *cParams;

    RETURN_ERROR_IF(ZSTD_cwksp_reserve_failed(ws), memory_allocation,
                    "failed a workspace allocation in ZSTD_reset_matchState");

    return 0;
}